

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_lobster.cpp
# Opt level: O3

void __thiscall
flatbuffers::lobster::LobsterGenerator::GenStructAccessor
          (LobsterGenerator *this,StructDef *struct_def,FieldDef *field,string *code_ptr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  BaseType BVar4;
  pointer pcVar5;
  EnumVal *pEVar6;
  long *plVar7;
  EnumDef *pEVar8;
  undefined8 *puVar9;
  size_t sVar10;
  long *plVar11;
  size_type *psVar12;
  undefined8 *puVar13;
  pointer ppEVar14;
  Type *type;
  char *pcVar15;
  undefined8 uVar16;
  _Alloc_hider _Var17;
  bool bVar18;
  string defval;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string acc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> def;
  string offsets;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  string local_128;
  undefined1 local_108 [24];
  uint16_t uStack_f0;
  undefined6 uStack_ee;
  LobsterGenerator *local_e8;
  string local_e0;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  string local_a0;
  Type *local_80;
  string local_78;
  FieldDef *local_58;
  string local_50;
  
  GenComment(&(field->super_Definition).doc_comment,code_ptr,(CommentConfig *)0x0,"    ");
  NumToString<unsigned_short>(&local_a0,(field->value).offset);
  local_e8 = this;
  EscapeKeyword((string *)local_108,this,(string *)field);
  plVar7 = (long *)std::__cxx11::string::replace((ulong)local_108,0,(char *)0x0,0x37206c);
  local_c0 = &local_b0;
  plVar11 = plVar7 + 2;
  if ((long *)*plVar7 == plVar11) {
    local_b0 = *plVar11;
    lStack_a8 = plVar7[3];
  }
  else {
    local_b0 = *plVar11;
    local_c0 = (long *)*plVar7;
  }
  type = &(field->value).type;
  local_b8 = plVar7[1];
  *plVar7 = (long)plVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  if ((_Alloc_hider *)local_108._0_8_ != (_Alloc_hider *)(local_108 + 0x10)) {
    operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
  }
  BVar4 = (((Value *)type)->type).base_type;
  if (BVar4 - BASE_TYPE_UTYPE < 0xc) {
    local_108._0_8_ = local_108 + 0x10;
    local_108._8_8_ = (StructDef *)0x0;
    local_108._16_8_ = local_108._16_8_ & 0xffffffffffffff00;
    if (struct_def->fixed == true) {
      GenTypeName_abi_cxx11_(&local_128,local_e8,type);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_128,0,(char *)0x0,0x372075);
      psVar12 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_148.field_2._M_allocated_capacity = *psVar12;
        local_148.field_2._8_8_ = plVar7[3];
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      }
      else {
        local_148.field_2._M_allocated_capacity = *psVar12;
        local_148._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_148._M_string_length = plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_148);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      psVar12 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_168.field_2._M_allocated_capacity = *psVar12;
        local_168.field_2._8_8_ = plVar7[3];
      }
      else {
        local_168.field_2._M_allocated_capacity = *psVar12;
        local_168._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_168._M_string_length = plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_168,(ulong)local_a0._M_dataplus._M_p);
      psVar12 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_188.field_2._M_allocated_capacity = *psVar12;
        local_188.field_2._8_8_ = plVar7[3];
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      }
      else {
        local_188.field_2._M_allocated_capacity = *psVar12;
        local_188._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_188._M_string_length = plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_188);
      plVar11 = plVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar11) {
        local_1a8.field_2._M_allocated_capacity = *plVar11;
        local_1a8.field_2._8_8_ = plVar7[3];
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *plVar11;
        local_1a8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_1a8._M_string_length = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_108,(string *)&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,
                        (ulong)(local_128.field_2._M_allocated_capacity + 1));
      }
    }
    else {
      if (field->presence == kOptional) {
        bVar18 = BVar4 - BASE_TYPE_FLOAT < 2;
        pcVar15 = "0";
        if (bVar18) {
          pcVar15 = "0.0";
        }
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1a8,pcVar15,pcVar15 + (ulong)bVar18 * 2 + 1);
      }
      else {
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        pcVar5 = (field->value).constant._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a8,pcVar5,pcVar5 + (field->value).constant._M_string_length);
      }
      GenTypeName_abi_cxx11_(&local_50,local_e8,type);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x3720f0);
      plVar11 = plVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar11) {
        local_78.field_2._M_allocated_capacity = *plVar11;
        local_78.field_2._8_8_ = plVar7[3];
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      }
      else {
        local_78.field_2._M_allocated_capacity = *plVar11;
        local_78._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_78._M_string_length = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_78);
      plVar11 = plVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar11) {
        local_e0.field_2._M_allocated_capacity = *plVar11;
        local_e0.field_2._8_8_ = plVar7[3];
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      }
      else {
        local_e0.field_2._M_allocated_capacity = *plVar11;
        local_e0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_e0._M_string_length = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_e0,(ulong)local_a0._M_dataplus._M_p);
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      plVar11 = plVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar11) {
        local_128.field_2._M_allocated_capacity = *plVar11;
        local_128.field_2._8_8_ = plVar7[3];
      }
      else {
        local_128.field_2._M_allocated_capacity = *plVar11;
        local_128._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_128._M_string_length = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_128);
      psVar12 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_148.field_2._M_allocated_capacity = *psVar12;
        local_148.field_2._8_8_ = plVar7[3];
        local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      }
      else {
        local_148.field_2._M_allocated_capacity = *psVar12;
        local_148._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_148._M_string_length = plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      local_80 = type;
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_148,(ulong)local_1a8._M_dataplus._M_p);
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      psVar12 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_168.field_2._M_allocated_capacity = *psVar12;
        local_168.field_2._8_8_ = plVar7[3];
      }
      else {
        local_168.field_2._M_allocated_capacity = *psVar12;
        local_168._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_168._M_string_length = plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_168);
      paVar1 = &local_188.field_2;
      psVar12 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_188.field_2._M_allocated_capacity = *psVar12;
        local_188.field_2._8_8_ = plVar7[3];
        local_188._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_188.field_2._M_allocated_capacity = *psVar12;
        local_188._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_188._M_string_length = plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_108,(string *)&local_188);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar1) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,
                        (ulong)(local_128.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,
                        (ulong)(local_e0.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        (ulong)(local_78.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if (((Type *)&local_80->base_type)->base_type == BASE_TYPE_BOOL) {
        std::operator+(&local_168,"bool(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108);
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_168);
        psVar12 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_188.field_2._M_allocated_capacity = *psVar12;
          local_188.field_2._8_8_ = plVar7[3];
          local_188._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_188.field_2._M_allocated_capacity = *psVar12;
          local_188._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_188._M_string_length = plVar7[1];
        *plVar7 = (long)psVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::operator=((string *)local_108,(string *)&local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar1) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
        }
      }
      type = local_80;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
        type = local_80;
      }
    }
    pEVar8 = (field->value).type.enum_def;
    if (pEVar8 != (EnumDef *)0x0) {
      EscapeKeyword(&local_148,local_e8,(string *)pEVar8);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_148);
      psVar12 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_168.field_2._M_allocated_capacity = *psVar12;
        local_168.field_2._8_8_ = plVar7[3];
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      }
      else {
        local_168.field_2._M_allocated_capacity = *psVar12;
        local_168._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_168._M_string_length = plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_168,local_108._0_8_);
      psVar12 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_188.field_2._M_allocated_capacity = *psVar12;
        local_188.field_2._8_8_ = plVar7[3];
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      }
      else {
        local_188.field_2._M_allocated_capacity = *psVar12;
        local_188._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_188._M_string_length = plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_188);
      plVar11 = plVar7 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar11) {
        local_1a8.field_2._M_allocated_capacity = *plVar11;
        local_1a8.field_2._8_8_ = plVar7[3];
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *plVar11;
        local_1a8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_1a8._M_string_length = plVar7[1];
      *plVar7 = (long)plVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::operator=((string *)local_108,(string *)&local_1a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
    }
    if (field->presence == kOptional) {
      std::operator+(&local_188,", flatbuffers.field_present(buf_, pos_, ",&local_a0);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_188);
      paVar1 = &local_1a8.field_2;
      psVar12 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_1a8.field_2._M_allocated_capacity = *psVar12;
        local_1a8.field_2._8_8_ = plVar7[3];
        local_1a8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *psVar12;
        local_1a8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_1a8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_108,(ulong)local_1a8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
      }
      paVar2 = &local_188.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar2) {
        operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
      }
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,local_c0,local_b8 + (long)local_c0);
      std::__cxx11::string::append((char *)&local_128);
      LobsterType_abi_cxx11_(&local_e0,local_e8,type);
      uVar16 = (EnumDef *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        uVar16 = local_128.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < (EnumDef *)(local_e0._M_string_length + local_128._M_string_length)) {
        uVar16 = (EnumDef *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          uVar16 = local_e0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < (EnumDef *)(local_e0._M_string_length + local_128._M_string_length))
        goto LAB_0029b9fe;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_e0,0,(char *)0x0,(ulong)local_128._M_dataplus._M_p);
      }
      else {
LAB_0029b9fe:
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_128,(ulong)local_e0._M_dataplus._M_p);
      }
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      puVar13 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_148.field_2._M_allocated_capacity = *puVar13;
        local_148.field_2._8_8_ = puVar9[3];
      }
      else {
        local_148.field_2._M_allocated_capacity = *puVar13;
        local_148._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_148._M_string_length = puVar9[1];
      *puVar9 = puVar13;
      puVar9[1] = 0;
      *(undefined1 *)puVar13 = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
      puVar13 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_168.field_2._M_allocated_capacity = *puVar13;
        local_168.field_2._8_8_ = puVar9[3];
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      }
      else {
        local_168.field_2._M_allocated_capacity = *puVar13;
        local_168._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_168._M_string_length = puVar9[1];
      *puVar9 = puVar13;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_168,local_108._0_8_);
      puVar13 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_188.field_2._M_allocated_capacity = *puVar13;
        local_188.field_2._8_8_ = puVar9[3];
        local_188._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_188.field_2._M_allocated_capacity = *puVar13;
        local_188._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_188._M_string_length = puVar9[1];
      *puVar9 = puVar13;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
      puVar13 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_1a8.field_2._M_allocated_capacity = *puVar13;
        local_1a8.field_2._8_8_ = puVar9[3];
        local_1a8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *puVar13;
        local_1a8._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_1a8._M_string_length = puVar9[1];
      *puVar9 = puVar13;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != paVar1) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != paVar2) {
        operator_delete(local_188._M_dataplus._M_p,
                        (ulong)(local_188.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
LAB_0029bbcf:
        operator_delete(local_168._M_dataplus._M_p,
                        (ulong)(local_168.field_2._M_allocated_capacity + 1));
      }
    }
    else {
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,local_c0,local_b8 + (long)local_c0);
      std::__cxx11::string::append((char *)&local_128);
      LobsterType_abi_cxx11_(&local_e0,local_e8,type);
      uVar16 = (EnumDef *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        uVar16 = local_128.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < (EnumDef *)(local_e0._M_string_length + local_128._M_string_length)) {
        uVar16 = (EnumDef *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          uVar16 = local_e0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < (EnumDef *)(local_e0._M_string_length + local_128._M_string_length))
        goto LAB_0029b8ce;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_e0,0,(char *)0x0,(ulong)local_128._M_dataplus._M_p);
      }
      else {
LAB_0029b8ce:
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_128,(ulong)local_e0._M_dataplus._M_p);
      }
      local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
      puVar13 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_148.field_2._M_allocated_capacity = *puVar13;
        local_148.field_2._8_8_ = puVar9[3];
      }
      else {
        local_148.field_2._M_allocated_capacity = *puVar13;
        local_148._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_148._M_string_length = puVar9[1];
      *puVar9 = puVar13;
      puVar9[1] = 0;
      *(undefined1 *)puVar13 = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
      puVar13 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_168.field_2._M_allocated_capacity = *puVar13;
        local_168.field_2._8_8_ = puVar9[3];
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      }
      else {
        local_168.field_2._M_allocated_capacity = *puVar13;
        local_168._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_168._M_string_length = puVar9[1];
      *puVar9 = puVar13;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_168,local_108._0_8_);
      puVar13 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_188.field_2._M_allocated_capacity = *puVar13;
        local_188.field_2._8_8_ = puVar9[3];
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      }
      else {
        local_188.field_2._M_allocated_capacity = *puVar13;
        local_188._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_188._M_string_length = puVar9[1];
      *puVar9 = puVar13;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
      puVar13 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_1a8.field_2._M_allocated_capacity = *puVar13;
        local_1a8.field_2._8_8_ = puVar9[3];
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *puVar13;
        local_1a8._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_1a8._M_string_length = puVar9[1];
      *puVar9 = puVar13;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,
                        (ulong)(local_188.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) goto LAB_0029bbcf;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,
                      (ulong)(local_148.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,(ulong)(local_e0.field_2._M_allocated_capacity + 1))
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,
                      (ulong)(local_128.field_2._M_allocated_capacity + 1));
    }
    uVar16 = local_108._16_8_;
    _Var17._M_p = (pointer)local_108._0_8_;
    if ((_Alloc_hider *)local_108._0_8_ == (_Alloc_hider *)(local_108 + 0x10)) goto LAB_0029d132;
  }
  else {
    switch(BVar4) {
    case BASE_TYPE_STRING:
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      local_80 = type;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,local_c0,local_b8 + (long)local_c0);
      std::__cxx11::string::append((char *)&local_188);
      puVar9 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_a0._M_dataplus._M_p);
      puVar13 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_1a8.field_2._M_allocated_capacity = *puVar13;
        local_1a8.field_2._8_8_ = puVar9[3];
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *puVar13;
        local_1a8._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_1a8._M_string_length = puVar9[1];
      *puVar9 = puVar13;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
      puVar13 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_108._16_8_ = *puVar13;
        _uStack_f0 = puVar9[3];
        local_108._0_8_ = (_Alloc_hider *)(local_108 + 0x10);
      }
      else {
        local_108._16_8_ = *puVar13;
        local_108._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar9;
      }
      local_108._8_8_ = puVar9[1];
      *puVar9 = puVar13;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      std::__cxx11::string::_M_append((char *)code_ptr,local_108._0_8_);
      if ((_Alloc_hider *)local_108._0_8_ != (_Alloc_hider *)(local_108 + 0x10)) {
        operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
      }
      uVar16 = local_188.field_2._M_allocated_capacity;
      _Var17._M_p = local_188._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
LAB_0029cfb6:
        operator_delete(_Var17._M_p,
                        (ulong)((long)&(((EnumDef *)uVar16)->super_Definition).name._M_dataplus._M_p
                               + 1));
      }
      break;
    case BASE_TYPE_VECTOR:
      local_108._0_4_ = (field->value).type.element;
      local_108._4_4_ = 0;
      local_108._8_8_ = (field->value).type.struct_def;
      local_108._16_8_ = (field->value).type.enum_def;
      uStack_f0 = (field->value).type.fixed_length;
      if (local_108._0_4_ == BASE_TYPE_STRING) {
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
        local_80 = type;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1a8,local_c0,local_b8 + (long)local_c0);
        std::__cxx11::string::append((char *)&local_1a8);
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,
                          (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
        }
        std::__cxx11::string::append((char *)code_ptr);
      }
      else {
        if (local_108._0_4_ == BASE_TYPE_STRUCT) {
          local_80 = type;
          std::operator+(&local_168,"flatbuffers.field_vector(buf_, pos_, ",&local_a0);
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_168);
          paVar1 = &local_188.field_2;
          plVar11 = plVar7 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)plVar11) {
            local_188.field_2._M_allocated_capacity = *plVar11;
            local_188.field_2._8_8_ = plVar7[3];
            local_188._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_188.field_2._M_allocated_capacity = *plVar11;
            local_188._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_188._M_string_length = plVar7[1];
          *plVar7 = (long)plVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          sVar10 = InlineSize((Type *)local_108);
          NumToString<unsigned_long>(&local_148,sVar10);
          uVar16 = (EnumDef *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar1) {
            uVar16 = local_188.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar16 < (EnumDef *)(local_148._M_string_length + local_188._M_string_length))
          {
            uVar16 = (EnumDef *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != &local_148.field_2) {
              uVar16 = local_148.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar16 < (EnumDef *)(local_148._M_string_length + local_188._M_string_length)
               ) goto LAB_0029c5bc;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_148,0,(char *)0x0,(ulong)local_188._M_dataplus._M_p);
          }
          else {
LAB_0029c5bc:
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_188,(ulong)local_148._M_dataplus._M_p);
          }
          local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
          puVar13 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_1a8.field_2._M_allocated_capacity = *puVar13;
            local_1a8.field_2._8_8_ = puVar9[3];
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *puVar13;
            local_1a8._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_1a8._M_string_length = puVar9[1];
          *puVar9 = puVar13;
          puVar9[1] = 0;
          *(undefined1 *)puVar13 = 0;
          paVar2 = &local_148.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar2) {
            operator_delete(local_148._M_dataplus._M_p,
                            (ulong)(local_148.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar1) {
            operator_delete(local_188._M_dataplus._M_p,
                            (ulong)(local_188.field_2._M_allocated_capacity + 1));
          }
          paVar3 = &local_168.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != paVar3) {
            operator_delete(local_168._M_dataplus._M_p,
                            (ulong)(local_168.field_2._M_allocated_capacity + 1));
          }
          if (*(bool *)(local_108._8_8_ + 0x110) == false) {
            std::operator+(&local_168,"flatbuffers.indirect(buf_, ",&local_1a8);
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_168);
            plVar11 = plVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar11) {
              local_188.field_2._M_allocated_capacity = *plVar11;
              local_188.field_2._8_8_ = plVar7[3];
              local_188._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_188.field_2._M_allocated_capacity = *plVar11;
              local_188._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_188._M_string_length = plVar7[1];
            *plVar7 = (long)plVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::__cxx11::string::operator=((string *)&local_1a8,(string *)&local_188);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != paVar1) {
              operator_delete(local_188._M_dataplus._M_p,
                              (ulong)(local_188.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != paVar3) {
              operator_delete(local_168._M_dataplus._M_p,
                              (ulong)(local_168.field_2._M_allocated_capacity + 1));
            }
          }
          local_148._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_148,local_c0,local_b8 + (long)local_c0);
          std::__cxx11::string::append((char *)&local_148);
          NamespacedName_abi_cxx11_
                    (&local_128,local_e8,&((field->value).type.struct_def)->super_Definition);
          uVar16 = (EnumDef *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar2) {
            uVar16 = local_148.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar16 < (EnumDef *)(local_128._M_string_length + local_148._M_string_length))
          {
            uVar16 = (EnumDef *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              uVar16 = local_128.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar16 < (EnumDef *)(local_128._M_string_length + local_148._M_string_length)
               ) goto LAB_0029ccdb;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::replace
                               ((ulong)&local_128,0,(char *)0x0,(ulong)local_148._M_dataplus._M_p);
          }
          else {
LAB_0029ccdb:
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_148,(ulong)local_128._M_dataplus._M_p);
          }
          psVar12 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_168.field_2._M_allocated_capacity = *psVar12;
            local_168.field_2._8_8_ = puVar9[3];
            local_168._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_168.field_2._M_allocated_capacity = *psVar12;
            local_168._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_168._M_string_length = puVar9[1];
          *puVar9 = psVar12;
          puVar9[1] = 0;
          *(undefined1 *)psVar12 = 0;
          plVar7 = (long *)std::__cxx11::string::append((char *)&local_168);
          psVar12 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar12) {
            local_188.field_2._M_allocated_capacity = *psVar12;
            local_188.field_2._8_8_ = plVar7[3];
            local_188._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_188.field_2._M_allocated_capacity = *psVar12;
            local_188._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_188._M_string_length = plVar7[1];
          *plVar7 = (long)psVar12;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_188._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar1) {
            operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != paVar3) {
            operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,
                            (ulong)(local_128.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar2) {
            operator_delete(local_148._M_dataplus._M_p,
                            (ulong)(local_148.field_2._M_allocated_capacity + 1));
          }
          NamespacedName_abi_cxx11_
                    (&local_128,local_e8,&((field->value).type.struct_def)->super_Definition);
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
          puVar13 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_148.field_2._M_allocated_capacity = *puVar13;
            local_148.field_2._8_8_ = puVar9[3];
            local_148._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_148.field_2._M_allocated_capacity = *puVar13;
            local_148._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_148._M_string_length = puVar9[1];
          *puVar9 = puVar13;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_148,(ulong)local_1a8._M_dataplus._M_p);
          puVar13 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_168.field_2._M_allocated_capacity = *puVar13;
            local_168.field_2._8_8_ = puVar9[3];
            local_168._M_dataplus._M_p = (pointer)paVar3;
          }
          else {
            local_168.field_2._M_allocated_capacity = *puVar13;
            local_168._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_168._M_string_length = puVar9[1];
          *puVar9 = puVar13;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
          puVar13 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_188.field_2._M_allocated_capacity = *puVar13;
            local_188.field_2._8_8_ = puVar9[3];
            local_188._M_dataplus._M_p = (pointer)paVar1;
          }
          else {
            local_188.field_2._M_allocated_capacity = *puVar13;
            local_188._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_188._M_string_length = puVar9[1];
          *puVar9 = puVar13;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_188._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar1) {
            operator_delete(local_188._M_dataplus._M_p,
                            (ulong)(local_188.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_168._M_dataplus._M_p != paVar3) {
            operator_delete(local_168._M_dataplus._M_p,
                            (ulong)(local_168.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != paVar2) {
            operator_delete(local_148._M_dataplus._M_p,
                            (ulong)(local_148.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,
                            (ulong)(local_128.field_2._M_allocated_capacity + 1));
          }
          uVar16 = local_1a8.field_2._M_allocated_capacity;
          _Var17._M_p = local_1a8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) goto LAB_0029cfb6;
          break;
        }
        paVar1 = &local_168.field_2;
        local_168._M_dataplus._M_p = (pointer)paVar1;
        local_80 = type;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_168,local_c0,local_b8 + (long)local_c0);
        std::__cxx11::string::append((char *)&local_168);
        LobsterType_abi_cxx11_(&local_148,local_e8,(Type *)local_108);
        uVar16 = (EnumDef *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != paVar1) {
          uVar16 = local_168.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < (EnumDef *)(local_148._M_string_length + local_168._M_string_length)) {
          uVar16 = (EnumDef *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_148._M_dataplus._M_p != &local_148.field_2) {
            uVar16 = local_148.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar16 < (EnumDef *)(local_148._M_string_length + local_168._M_string_length))
          goto LAB_0029bf31;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_148,0,(char *)0x0,(ulong)local_168._M_dataplus._M_p);
        }
        else {
LAB_0029bf31:
          puVar9 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_168,(ulong)local_148._M_dataplus._M_p);
        }
        local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
        psVar12 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_188.field_2._M_allocated_capacity = *psVar12;
          local_188.field_2._8_8_ = puVar9[3];
        }
        else {
          local_188.field_2._M_allocated_capacity = *psVar12;
          local_188._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_188._M_string_length = puVar9[1];
        *puVar9 = psVar12;
        puVar9[1] = 0;
        *(undefined1 *)psVar12 = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_188);
        paVar2 = &local_1a8.field_2;
        psVar12 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_1a8.field_2._M_allocated_capacity = *psVar12;
          local_1a8.field_2._8_8_ = plVar7[3];
          local_1a8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *psVar12;
          local_1a8._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_1a8._M_string_length = plVar7[1];
        *plVar7 = (long)psVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != paVar2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        paVar3 = &local_188.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar3) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,
                          (ulong)(local_148.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != paVar1) {
          operator_delete(local_168._M_dataplus._M_p,
                          (ulong)(local_168.field_2._M_allocated_capacity + 1));
        }
        GenTypeName_abi_cxx11_(&local_168,local_e8,(Type *)local_108);
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,0x37207a);
        puVar13 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_188.field_2._M_allocated_capacity = *puVar13;
          local_188.field_2._8_8_ = puVar9[3];
          local_188._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_188.field_2._M_allocated_capacity = *puVar13;
          local_188._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_188._M_string_length = puVar9[1];
        *puVar9 = puVar13;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_188);
        plVar11 = plVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar11) {
          local_1a8.field_2._M_allocated_capacity = *plVar11;
          local_1a8.field_2._8_8_ = plVar7[3];
          local_1a8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *plVar11;
          local_1a8._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_1a8._M_string_length = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != paVar2) {
          operator_delete(local_1a8._M_dataplus._M_p,
                          (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar3) {
          operator_delete(local_188._M_dataplus._M_p,
                          (ulong)(local_188.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != paVar1) {
          operator_delete(local_168._M_dataplus._M_p,
                          (ulong)(local_168.field_2._M_allocated_capacity + 1));
        }
      }
      std::operator+(&local_148,"(buf_, buf_.flatbuffers.field_vector(pos_, ",&local_a0);
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
      paVar1 = &local_168.field_2;
      puVar13 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_168.field_2._M_allocated_capacity = *puVar13;
        local_168.field_2._8_8_ = puVar9[3];
        local_168._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_168.field_2._M_allocated_capacity = *puVar13;
        local_168._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_168._M_string_length = puVar9[1];
      *puVar9 = puVar13;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      sVar10 = InlineSize((Type *)local_108);
      NumToString<unsigned_long>(&local_128,sVar10);
      uVar16 = (EnumDef *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != paVar1) {
        uVar16 = local_168.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < (EnumDef *)(local_128._M_string_length + local_168._M_string_length)) {
        uVar16 = (EnumDef *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          uVar16 = local_128.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar16 < (EnumDef *)(local_128._M_string_length + local_168._M_string_length))
        goto LAB_0029c97b;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_128,0,(char *)0x0,(ulong)local_168._M_dataplus._M_p);
      }
      else {
LAB_0029c97b:
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_168,(ulong)local_128._M_dataplus._M_p);
      }
      local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
      puVar13 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_188.field_2._M_allocated_capacity = *puVar13;
        local_188.field_2._8_8_ = puVar9[3];
      }
      else {
        local_188.field_2._M_allocated_capacity = *puVar13;
        local_188._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_188._M_string_length = puVar9[1];
      *puVar9 = puVar13;
      puVar9[1] = 0;
      *(undefined1 *)puVar13 = 0;
      puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
      puVar13 = puVar9 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar13) {
        local_1a8.field_2._M_allocated_capacity = *puVar13;
        local_1a8.field_2._8_8_ = puVar9[3];
        local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
      }
      else {
        local_1a8.field_2._M_allocated_capacity = *puVar13;
        local_1a8._M_dataplus._M_p = (pointer)*puVar9;
      }
      local_1a8._M_string_length = puVar9[1];
      *puVar9 = puVar13;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
        operator_delete(local_1a8._M_dataplus._M_p,
                        (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_188._M_dataplus._M_p != &local_188.field_2) {
        operator_delete(local_188._M_dataplus._M_p,
                        (ulong)(local_188.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p,
                        (ulong)(local_128.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != paVar1) {
        operator_delete(local_168._M_dataplus._M_p,
                        (ulong)(local_168.field_2._M_allocated_capacity + 1));
      }
      uVar16 = local_148.field_2._M_allocated_capacity;
      _Var17._M_p = local_148._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) goto LAB_0029cfb6;
      break;
    case BASE_TYPE_STRUCT:
      local_80 = type;
      NamespacedName_abi_cxx11_
                ((string *)local_108,local_e8,&((field->value).type.struct_def)->super_Definition);
      if (struct_def->fixed == true) {
        paVar1 = &local_168.field_2;
        local_168._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_168,local_c0,local_b8 + (long)local_c0);
        std::__cxx11::string::append((char *)&local_168);
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_168,local_108._0_8_);
        paVar2 = &local_188.field_2;
        psVar12 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_188.field_2._M_allocated_capacity = *psVar12;
          local_188.field_2._8_8_ = plVar7[3];
          local_188._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_188.field_2._M_allocated_capacity = *psVar12;
          local_188._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_188._M_string_length = plVar7[1];
        *plVar7 = (long)psVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_188);
        paVar3 = &local_1a8.field_2;
        psVar12 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_1a8.field_2._M_allocated_capacity = *psVar12;
          local_1a8.field_2._8_8_ = plVar7[3];
          local_1a8._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *psVar12;
          local_1a8._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_1a8._M_string_length = plVar7[1];
        *plVar7 = (long)psVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != paVar3) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar2) {
          operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != paVar1) {
          operator_delete(local_168._M_dataplus._M_p,
                          (ulong)(local_168.field_2._M_allocated_capacity + 1));
        }
        std::operator+(&local_148,"return ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_108);
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
        puVar13 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_168.field_2._M_allocated_capacity = *puVar13;
          local_168.field_2._8_8_ = puVar9[3];
          local_168._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_168.field_2._M_allocated_capacity = *puVar13;
          local_168._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_168._M_string_length = puVar9[1];
        *puVar9 = puVar13;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_168,(ulong)local_a0._M_dataplus._M_p);
        puVar13 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_188.field_2._M_allocated_capacity = *puVar13;
          local_188.field_2._8_8_ = puVar9[3];
          local_188._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_188.field_2._M_allocated_capacity = *puVar13;
          local_188._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_188._M_string_length = puVar9[1];
        *puVar9 = puVar13;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
        puVar13 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_1a8.field_2._M_allocated_capacity = *puVar13;
          local_1a8.field_2._8_8_ = puVar9[3];
          local_1a8._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *puVar13;
          local_1a8._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_1a8._M_string_length = puVar9[1];
        *puVar9 = puVar13;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != paVar3) {
          operator_delete(local_1a8._M_dataplus._M_p,
                          (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar2) {
          operator_delete(local_188._M_dataplus._M_p,
                          (ulong)(local_188.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != paVar1) {
          operator_delete(local_168._M_dataplus._M_p,
                          (ulong)(local_168.field_2._M_allocated_capacity + 1));
        }
        uVar16 = local_148.field_2._M_allocated_capacity;
        _Var17._M_p = local_148._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) goto LAB_0029c624;
      }
      else {
        paVar1 = &local_188.field_2;
        local_188._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_188,local_c0,local_b8 + (long)local_c0);
        std::__cxx11::string::append((char *)&local_188);
        plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_188,local_108._0_8_);
        paVar2 = &local_1a8.field_2;
        psVar12 = (size_type *)(plVar7 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar12) {
          local_1a8.field_2._M_allocated_capacity = *psVar12;
          local_1a8.field_2._8_8_ = plVar7[3];
          local_1a8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *psVar12;
          local_1a8._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_1a8._M_string_length = plVar7[1];
        *plVar7 = (long)psVar12;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != paVar2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar1) {
          operator_delete(local_188._M_dataplus._M_p,
                          (ulong)(local_188.field_2._M_allocated_capacity + 1));
        }
        if (field->presence != kRequired) {
          std::__cxx11::string::append((char *)code_ptr);
        }
        std::__cxx11::string::append((char *)code_ptr);
        local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_128,"let o = flatbuffers.field_","");
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
        puVar13 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_148.field_2._M_allocated_capacity = *puVar13;
          local_148.field_2._8_8_ = puVar9[3];
          local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
        }
        else {
          local_148.field_2._M_allocated_capacity = *puVar13;
          local_148._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_148._M_string_length = puVar9[1];
        *puVar9 = puVar13;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_148);
        puVar13 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_168.field_2._M_allocated_capacity = *puVar13;
          local_168.field_2._8_8_ = puVar9[3];
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        }
        else {
          local_168.field_2._M_allocated_capacity = *puVar13;
          local_168._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_168._M_string_length = puVar9[1];
        *puVar9 = puVar13;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_168,(ulong)local_a0._M_dataplus._M_p);
        puVar13 = puVar9 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar13) {
          local_188.field_2._M_allocated_capacity = *puVar13;
          local_188.field_2._8_8_ = puVar9[3];
          local_188._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_188.field_2._M_allocated_capacity = *puVar13;
          local_188._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_188._M_string_length = puVar9[1];
        *puVar9 = puVar13;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        plVar7 = (long *)std::__cxx11::string::append((char *)&local_188);
        plVar11 = plVar7 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar7 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)plVar11) {
          local_1a8.field_2._M_allocated_capacity = *plVar11;
          local_1a8.field_2._8_8_ = plVar7[3];
          local_1a8._M_dataplus._M_p = (pointer)paVar2;
        }
        else {
          local_1a8.field_2._M_allocated_capacity = *plVar11;
          local_1a8._M_dataplus._M_p = (pointer)*plVar7;
        }
        local_1a8._M_string_length = plVar7[1];
        *plVar7 = (long)plVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
        std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != paVar2) {
          operator_delete(local_1a8._M_dataplus._M_p,
                          (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188._M_dataplus._M_p != paVar1) {
          operator_delete(local_188._M_dataplus._M_p,
                          (ulong)(local_188.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_168._M_dataplus._M_p != &local_168.field_2) {
          operator_delete(local_168._M_dataplus._M_p,
                          (ulong)(local_168.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_148._M_dataplus._M_p != &local_148.field_2) {
          operator_delete(local_148._M_dataplus._M_p,
                          (ulong)(local_148.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,
                          (ulong)(local_128.field_2._M_allocated_capacity + 1));
        }
        if (field->presence == kRequired) {
          local_1a8._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1a8,local_108._0_8_,
                     (char *)(local_108._0_8_ + (long)(Definition *)local_108._8_8_));
          std::__cxx11::string::append((char *)&local_1a8);
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
          uVar16 = local_1a8.field_2._M_allocated_capacity;
          _Var17._M_p = local_1a8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != paVar2) goto LAB_0029c624;
        }
        else {
          std::operator+(&local_188,"if o: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108);
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
          puVar13 = puVar9 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar13) {
            local_1a8.field_2._M_allocated_capacity = *puVar13;
            local_1a8.field_2._8_8_ = puVar9[3];
            local_1a8._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_1a8.field_2._M_allocated_capacity = *puVar13;
            local_1a8._M_dataplus._M_p = (pointer)*puVar9;
          }
          local_1a8._M_string_length = puVar9[1];
          *puVar9 = puVar13;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          std::__cxx11::string::_M_append((char *)code_ptr,(ulong)local_1a8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a8._M_dataplus._M_p != paVar2) {
            operator_delete(local_1a8._M_dataplus._M_p,
                            (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
          }
          uVar16 = local_188.field_2._M_allocated_capacity;
          _Var17._M_p = local_188._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_188._M_dataplus._M_p != paVar1) {
LAB_0029c624:
            operator_delete(_Var17._M_p,
                            (ulong)((long)&(((EnumDef *)uVar16)->super_Definition).name._M_dataplus.
                                           _M_p + 1));
          }
        }
      }
      uVar16 = local_108._16_8_;
      _Var17._M_p = (pointer)local_108._0_8_;
      if ((_Alloc_hider *)local_108._0_8_ != (_Alloc_hider *)(local_108 + 0x10)) goto LAB_0029cfb6;
      break;
    case BASE_TYPE_UNION:
      pEVar8 = (field->value).type.enum_def;
      ppEVar14 = (pEVar8->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      local_80 = type;
      local_58 = field;
      if (ppEVar14 !=
          (pEVar8->vals).vec.
          super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        paVar1 = &local_148.field_2;
        do {
          pEVar6 = *ppEVar14;
          if (pEVar6->value != 0) {
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_e0,local_c0,local_b8 + (long)local_c0);
            std::__cxx11::string::append((char *)&local_e0);
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_e0,(ulong)(pEVar6->name)._M_dataplus._M_p);
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            plVar11 = plVar7 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar11) {
              local_128.field_2._M_allocated_capacity = *plVar11;
              local_128.field_2._8_8_ = plVar7[3];
            }
            else {
              local_128.field_2._M_allocated_capacity = *plVar11;
              local_128._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_128._M_string_length = plVar7[1];
            *plVar7 = (long)plVar11;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_128);
            puVar13 = puVar9 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_148.field_2._M_allocated_capacity = *puVar13;
              local_148.field_2._8_8_ = puVar9[3];
              local_148._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_148.field_2._M_allocated_capacity = *puVar13;
              local_148._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_148._M_string_length = puVar9[1];
            *puVar9 = puVar13;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            NamespacedName_abi_cxx11_
                      (&local_78,local_e8,&((pEVar6->union_type).struct_def)->super_Definition);
            uVar16 = (EnumDef *)0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar1) {
              uVar16 = local_148.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar16 < (EnumDef *)(local_78._M_string_length + local_148._M_string_length))
            {
              uVar16 = (EnumDef *)0xf;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                uVar16 = local_78.field_2._M_allocated_capacity;
              }
              if ((ulong)uVar16 <
                  (EnumDef *)(local_78._M_string_length + local_148._M_string_length))
              goto LAB_0029abaa;
              puVar9 = (undefined8 *)
                       std::__cxx11::string::replace
                                 ((ulong)&local_78,0,(char *)0x0,(ulong)local_148._M_dataplus._M_p);
            }
            else {
LAB_0029abaa:
              puVar9 = (undefined8 *)
                       std::__cxx11::string::_M_append
                                 ((char *)&local_148,(ulong)local_78._M_dataplus._M_p);
            }
            local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
            puVar13 = puVar9 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_168.field_2._M_allocated_capacity = *puVar13;
              local_168.field_2._8_8_ = puVar9[3];
            }
            else {
              local_168.field_2._M_allocated_capacity = *puVar13;
              local_168._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_168._M_string_length = puVar9[1];
            *puVar9 = puVar13;
            puVar9[1] = 0;
            *(undefined1 *)puVar13 = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_168);
            puVar13 = puVar9 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_188.field_2._M_allocated_capacity = *puVar13;
              local_188.field_2._8_8_ = puVar9[3];
              local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
            }
            else {
              local_188.field_2._M_allocated_capacity = *puVar13;
              local_188._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_188._M_string_length = puVar9[1];
            *puVar9 = puVar13;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            puVar9 = (undefined8 *)
                     std::__cxx11::string::_M_append
                               ((char *)&local_188,(ulong)local_a0._M_dataplus._M_p);
            puVar13 = puVar9 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_1a8.field_2._M_allocated_capacity = *puVar13;
              local_1a8.field_2._8_8_ = puVar9[3];
              local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
            }
            else {
              local_1a8.field_2._M_allocated_capacity = *puVar13;
              local_1a8._M_dataplus._M_p = (pointer)*puVar9;
            }
            local_1a8._M_string_length = puVar9[1];
            *puVar9 = puVar13;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
            local_108._0_8_ = local_108 + 0x10;
            puVar13 = puVar9 + 2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*puVar9 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)puVar13) {
              local_108._16_8_ = *puVar13;
              _uStack_f0 = puVar9[3];
            }
            else {
              local_108._16_8_ = *puVar13;
              local_108._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)*puVar9;
            }
            local_108._8_8_ = puVar9[1];
            *puVar9 = puVar13;
            puVar9[1] = 0;
            *(undefined1 *)(puVar9 + 2) = 0;
            std::__cxx11::string::_M_append((char *)code_ptr,local_108._0_8_);
            if ((_Alloc_hider *)local_108._0_8_ != (_Alloc_hider *)(local_108 + 0x10)) {
              operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,
                              (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p != &local_188.field_2) {
              operator_delete(local_188._M_dataplus._M_p,
                              (ulong)(local_188.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p != &local_168.field_2) {
              operator_delete(local_168._M_dataplus._M_p,
                              (ulong)(local_168.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,
                              (ulong)(local_78.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p != paVar1) {
              operator_delete(local_148._M_dataplus._M_p,
                              (ulong)(local_148.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,
                              (ulong)(local_128.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
              operator_delete(local_e0._M_dataplus._M_p,
                              (ulong)(local_e0.field_2._M_allocated_capacity + 1));
            }
            pEVar8 = (local_58->value).type.enum_def;
          }
          ppEVar14 = ppEVar14 + 1;
        } while (ppEVar14 !=
                 (pEVar8->vals).vec.
                 super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_gen_lobster.cpp"
                    ,0xd0,
                    "void flatbuffers::lobster::LobsterGenerator::GenStructAccessor(const StructDef &, const FieldDef &, std::string *)"
                   );
    }
    BVar4 = ((Type *)&local_80->base_type)->base_type;
    if ((BVar4 != BASE_TYPE_VECTOR64) && (BVar4 != BASE_TYPE_VECTOR)) goto LAB_0029d132;
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_188,local_c0,local_b8 + (long)local_c0);
    std::__cxx11::string::append((char *)&local_188);
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_a0._M_dataplus._M_p);
    puVar13 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_1a8.field_2._M_allocated_capacity = *puVar13;
      local_1a8.field_2._8_8_ = puVar9[3];
      local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    }
    else {
      local_1a8.field_2._M_allocated_capacity = *puVar13;
      local_1a8._M_dataplus._M_p = (pointer)*puVar9;
    }
    local_1a8._M_string_length = puVar9[1];
    *puVar9 = puVar13;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1a8);
    local_108._0_8_ = local_108 + 0x10;
    puVar13 = puVar9 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar13) {
      local_108._16_8_ = *puVar13;
      _uStack_f0 = puVar9[3];
    }
    else {
      local_108._16_8_ = *puVar13;
      local_108._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar9;
    }
    local_108._8_8_ = puVar9[1];
    *puVar9 = puVar13;
    puVar9[1] = 0;
    *(undefined1 *)(puVar9 + 2) = 0;
    std::__cxx11::string::_M_append((char *)code_ptr,local_108._0_8_);
    if ((_Alloc_hider *)local_108._0_8_ != (_Alloc_hider *)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_,(ulong)(local_108._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,
                      (ulong)(local_1a8.field_2._M_allocated_capacity + 1));
    }
    uVar16 = local_188.field_2._M_allocated_capacity;
    _Var17._M_p = local_188._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p == &local_188.field_2) goto LAB_0029d132;
  }
  operator_delete(_Var17._M_p,
                  (ulong)((long)&(((EnumDef *)uVar16)->super_Definition).name._M_dataplus._M_p + 1))
  ;
LAB_0029d132:
  if (local_c0 != &local_b0) {
    operator_delete(local_c0,local_b0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void GenStructAccessor(const StructDef &struct_def, const FieldDef &field,
                         std::string *code_ptr) {
    GenComment(field.doc_comment, code_ptr, nullptr, "    ");
    std::string &code = *code_ptr;
    auto offsets = NumToString(field.value.offset);
    auto def = "    def " + NormalizedName(field);
    if (IsScalar(field.value.type.base_type)) {
      std::string acc;
      if (struct_def.fixed) {
        acc = "buf_.read_" + GenTypeName(field.value.type) + "_le(pos_ + " +
              offsets + ")";

      } else {
        auto defval = field.IsOptional()
                          ? (IsFloat(field.value.type.base_type) ? "0.0" : "0")
                          : field.value.constant;
        acc = "flatbuffers.field_" + GenTypeName(field.value.type) +
              "(buf_, pos_, " + offsets + ", " + defval + ")";
        if (IsBool(field.value.type.base_type)) acc = "bool(" + acc + ")";
      }
      if (field.value.type.enum_def)
        acc = NormalizedName(*field.value.type.enum_def) + "(" + acc + ")";
      if (field.IsOptional()) {
        acc += ", flatbuffers.field_present(buf_, pos_, " + offsets + ")";
        code += def + "() -> " + LobsterType(field.value.type) +
                ", bool:\n        return " + acc + "\n";
      } else {
        code += def + "() -> " + LobsterType(field.value.type) +
                ":\n        return " + acc + "\n";
      }
      return;
    }
    switch (field.value.type.base_type) {
      case BASE_TYPE_STRUCT: {
        auto name = NamespacedName(*field.value.type.struct_def);
        if (struct_def.fixed) {
          code += def + "() -> " + name + ":\n        ";
          code += "return " + name + "{ buf_, pos_ + " + offsets + " }\n";
        } else {
          code += def + "() -> " + name;
          if (!field.IsRequired()) code += "?";
          code += ":\n        ";
          code += std::string("let o = flatbuffers.field_") +
                  (field.value.type.struct_def->fixed ? "struct" : "table") +
                  "(buf_, pos_, " + offsets + ")\n        return ";
          if (field.IsRequired()) {
            code += name + " { buf_, assert o }\n";
          } else {
            code += "if o: " + name + " { buf_, o } else: nil\n";
          }
        }
        break;
      }
      case BASE_TYPE_STRING:
        code += def +
                "() -> string:\n        return "
                "flatbuffers.field_string(buf_, pos_, " +
                offsets + ")\n";
        break;
      case BASE_TYPE_VECTOR: {
        auto vectortype = field.value.type.VectorType();
        if (vectortype.base_type == BASE_TYPE_STRUCT) {
          auto start = "flatbuffers.field_vector(buf_, pos_, " + offsets +
                       ") + i * " + NumToString(InlineSize(vectortype));
          if (!(vectortype.struct_def->fixed)) {
            start = "flatbuffers.indirect(buf_, " + start + ")";
          }
          code += def + "(i:int) -> " +
                  NamespacedName(*field.value.type.struct_def) +
                  ":\n        return ";
          code += NamespacedName(*field.value.type.struct_def) + " { buf_, " +
                  start + " }\n";
        } else {
          if (IsString(vectortype)) {
            code += def + "(i:int) -> string:\n        return ";
            code += "flatbuffers.string";
          } else {
            code += def + "(i:int) -> " + LobsterType(vectortype) +
                    ":\n        return ";
            code += "read_" + GenTypeName(vectortype) + "_le";
          }
          code += "(buf_, buf_.flatbuffers.field_vector(pos_, " + offsets +
                  ") + i * " + NumToString(InlineSize(vectortype)) + ")\n";
        }
        break;
      }
      case BASE_TYPE_UNION: {
        for (auto it = field.value.type.enum_def->Vals().begin();
             it != field.value.type.enum_def->Vals().end(); ++it) {
          auto &ev = **it;
          if (ev.IsNonZero()) {
            code += def + "_as_" + ev.name + "():\n        return " +
                    NamespacedName(*ev.union_type.struct_def) +
                    " { buf_, flatbuffers.field_table(buf_, pos_, " + offsets +
                    ") }\n";
          }
        }
        break;
      }
      default: FLATBUFFERS_ASSERT(0);
    }
    if (IsVector(field.value.type)) {
      code += def +
              "_length() -> int:\n        return "
              "flatbuffers.field_vector_len(buf_, pos_, " +
              offsets + ")\n";
    }
  }